

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

nng_err nni_aio_set_iov(nni_aio *aio,uint nio,nni_iov *iov)

{
  uint local_2c;
  uint i;
  nni_iov *iov_local;
  uint nio_local;
  nni_aio *aio_local;
  
  if (nio < 9) {
    if (iov != aio->a_iov) {
      for (local_2c = 0; local_2c < nio; local_2c = local_2c + 1) {
        aio->a_iov[local_2c].iov_buf = iov[local_2c].iov_buf;
        aio->a_iov[local_2c].iov_len = iov[local_2c].iov_len;
      }
    }
    aio->a_nio = nio;
    aio_local._4_4_ = NNG_OK;
  }
  else {
    aio_local._4_4_ = NNG_EINVAL;
  }
  return aio_local._4_4_;
}

Assistant:

nng_err
nni_aio_set_iov(nni_aio *aio, unsigned nio, const nni_iov *iov)
{

	if (nio > NNI_NUM_ELEMENTS((aio->a_iov))) {
		return (NNG_EINVAL);
	}

	// Sometimes we are resubmitting our own io vector, with
	// just a smaller count.  We copy them only if we are not.
	if (iov != &aio->a_iov[0]) {
		for (unsigned i = 0; i < nio; i++) {
			aio->a_iov[i] = iov[i];
		}
	}
	aio->a_nio = nio;
	return (NNG_OK);
}